

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derOIDDec(char *oid,size_t *len,octet *der,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  uint val;
  u32 val_00;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  u32 t;
  int local_50;
  u32 local_4c;
  size_t *local_48;
  size_t local_40;
  size_t local_38;
  
  sVar1 = derTLDec(&local_4c,&local_38,der,count);
  if (((sVar1 == 0xffffffffffffffff) || (uVar6 = local_38 + sVar1, count < uVar6)) ||
     (local_4c != 6 || uVar6 == 0xffffffffffffffff)) {
LAB_001197e6:
    uVar6 = 0xffffffffffffffff;
  }
  else {
    val = 0;
    local_48 = len;
    if (local_38 == 0) {
      sVar5 = 0;
    }
    else {
      local_50 = 3;
      sVar5 = 0;
      sVar3 = 0;
      local_40 = local_38;
      do {
        if (0x1ffffff < val) goto LAB_001197e6;
        val = der[sVar3 + sVar1] & 0x7f | val << 7;
        if (-1 < (char)der[sVar3 + sVar1]) {
          if (local_50 == 3) {
            local_50 = 0;
            if (val < 0x28) {
              val_00 = 0;
            }
            else if (val < 0x50) {
              val = val - 0x28;
              val_00 = 1;
            }
            else {
              val = val - 0x50;
              val_00 = 2;
            }
            pcVar4 = oid + sVar5;
            if (oid == (char *)0x0) {
              pcVar4 = (char *)0x0;
            }
            sVar2 = derSIDDec(pcVar4,val_00);
            sVar5 = sVar5 + sVar2;
          }
          if (oid != (char *)0x0) {
            oid[sVar5] = '.';
          }
          pcVar4 = oid + sVar5 + 1;
          if (oid == (char *)0x0) {
            pcVar4 = (char *)0x0;
          }
          sVar2 = derSIDDec(pcVar4,val);
          sVar5 = sVar5 + sVar2 + 1;
          val = 0;
          local_38 = local_40;
        }
        sVar3 = sVar3 + 1;
      } while (local_38 != sVar3);
    }
    if (oid != (char *)0x0) {
      oid[sVar5] = '\0';
    }
    if (local_48 != (size_t *)0x0) {
      *local_48 = sVar5;
    }
  }
  return uVar6;
}

Assistant:

size_t derOIDDec(char* oid, size_t* len, const octet der[], size_t count)
{
	u32 d1 = 3;
	u32 val = 0;
	size_t l, pos, oid_len;
	// pre
	ASSERT(memIsValid(der, count));
	// проверить тег и определить значение
	count = derDec2(&der, &l, der, count, 0x06);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// обработать sid
	for (pos = oid_len = 0; pos < l; ++pos)
	{
		// переполнение?
		if (val & 0xFE000000)
			return SIZE_MAX;
		// лидирующий 0?
		if (val == 0 && der[pos] == 128)
			return SIZE_MAX;
		// обработать октет sid
		val <<= 7, val |= (size_t)der[pos] & 127;
		// последний октет sid?
		if ((der[pos] & 128) == 0)
		{
			// первый sid?
			if (d1 == 3)
			{
				if (val < 40)
					d1 = 0;
				else if (val < 80)
					d1 = 1, val -= 40;
				else
					d1 = 2, val -= 80;
				oid_len += derSIDDec(oid ? oid + oid_len : oid, d1);
				d1 = 0;
			}
			// добавить ".val"
			oid ? oid[oid_len++] = '.' : oid_len++;
			oid_len += derSIDDec(oid ? oid + oid_len : oid, val);
			// к следующему sid
			val = 0;
		}
	}
	// очистка и выход
	d1 = val = 0, pos = l = 0;
	oid ? oid[oid_len] = '\0' : oid_len;
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		ASSERT(oid == 0 || memIsDisjoint2(len, O_PER_S, oid, strLen(oid)));
		*len = oid_len;
	}
	return count;
}